

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSetMap.cxx
# Opt level: O0

cmExportSet * __thiscall cmExportSetMap::operator[](cmExportSetMap *this,string *name)

{
  iterator __x;
  bool bVar1;
  cmExportSet *this_00;
  pointer ppVar2;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_cmExportSet_*>_>::value,_pair<iterator,_bool>_>
  _Var3;
  string local_88;
  cmExportSet *local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>
  local_60;
  _Base_ptr local_38;
  undefined1 local_30;
  _Self local_28;
  _Self local_20;
  iterator it;
  string *name_local;
  cmExportSetMap *this_local;
  
  it._M_node = (_Base_ptr)name;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
       ::find(&this->
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
              ,name);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
       ::end(&this->
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
            );
  bVar1 = std::operator==(&local_20,&local_28);
  __x = it;
  if (bVar1) {
    this_00 = (cmExportSet *)operator_new(0x50);
    std::__cxx11::string::string((string *)&local_88,(string *)it._M_node);
    cmExportSet::cmExportSet(this_00,&local_88);
    local_68 = this_00;
    std::make_pair<std::__cxx11::string_const&,cmExportSet*>
              (&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x._M_node,
               &local_68);
    _Var3 = std::
            map<std::__cxx11::string,cmExportSet*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportSet*>>>
            ::insert<std::pair<std::__cxx11::string,cmExportSet*>>
                      ((map<std::__cxx11::string,cmExportSet*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportSet*>>>
                        *)this,&local_60);
    local_38 = (_Base_ptr)_Var3.first._M_node;
    local_30 = _Var3.second;
    local_20._M_node = local_38;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>
    ::~pair(&local_60);
    std::__cxx11::string::~string((string *)&local_88);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>
           ::operator->(&local_20);
  return ppVar2->second;
}

Assistant:

cmExportSet* cmExportSetMap::operator[](const std::string& name)
{
  std::map<std::string, cmExportSet*>::iterator it = this->find(name);
  if (it == this->end()) // Export set not found
  {
    it = this->insert(std::make_pair(name, new cmExportSet(name))).first;
  }
  return it->second;
}